

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

Gia_Obj_t * Gia_ManAppendObj(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  long lVar7;
  
  uVar1 = p->nObjs;
  uVar2 = p->nObjsAlloc;
  if (uVar1 == uVar2) {
    uVar4 = uVar2 * 2;
    if (0x1fffffff < (int)(uVar2 * 2)) {
      uVar4 = 0x20000000;
    }
    if (uVar1 == 0x20000000) {
      puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
      exit(1);
    }
    if ((int)uVar4 <= (int)uVar1) {
      __assert_fail("p->nObjs < nObjNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x282,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    if (p->fVerbose != 0) {
      printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar4);
    }
    if (p->nObjsAlloc < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x285,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    lVar7 = (long)(int)uVar4;
    if (p->pObjs == (Gia_Obj_t *)0x0) {
      pGVar5 = (Gia_Obj_t *)malloc(lVar7 * 0xc);
    }
    else {
      pGVar5 = (Gia_Obj_t *)realloc(p->pObjs,lVar7 * 0xc);
    }
    p->pObjs = pGVar5;
    memset(pGVar5 + p->nObjsAlloc,0,(lVar7 - p->nObjsAlloc) * 0xc);
    if (p->pMuxes != (uint *)0x0) {
      puVar6 = (uint *)realloc(p->pMuxes,lVar7 * 4);
      p->pMuxes = puVar6;
      memset(puVar6 + p->nObjsAlloc,0,(lVar7 - p->nObjsAlloc) * 4);
    }
    p->nObjsAlloc = uVar4;
  }
  if ((p->vHTable).nSize != 0) {
    Vec_IntPush(&p->vHash,0);
  }
  iVar3 = p->nObjs;
  p->nObjs = iVar3 + 1;
  if (-1 < (long)iVar3) {
    return p->pObjs + iVar3;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManAppendObj( Gia_Man_t * p )  
{ 
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, (1 << 29) );
        if ( p->nObjs == (1 << 29) )
            printf( "Hard limit on the number of nodes (2^29) is reached. Quitting...\n" ), exit(1);
        assert( p->nObjs < nObjNew );
        if ( p->fVerbose )
            printf("Extending GIA object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
        assert( p->nObjsAlloc > 0 );
        p->pObjs = ABC_REALLOC( Gia_Obj_t, p->pObjs, nObjNew );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gia_Obj_t) * (nObjNew - p->nObjsAlloc) );
        if ( p->pMuxes )
        {
            p->pMuxes = ABC_REALLOC( unsigned, p->pMuxes, nObjNew );
            memset( p->pMuxes + p->nObjsAlloc, 0, sizeof(unsigned) * (nObjNew - p->nObjsAlloc) );
        }
        p->nObjsAlloc = nObjNew;
    }
    if ( Vec_IntSize(&p->vHTable) ) Vec_IntPush( &p->vHash, 0 );
    return Gia_ManObj( p, p->nObjs++ );
}